

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

bool __thiscall GGWave::decode(GGWave *this,void *data,uint32_t nBytes)

{
  Resampler *this_00;
  uchar *puVar1;
  float *pfVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char *__ptr;
  float *pfVar10;
  long lVar11;
  uint uVar12;
  float factor;
  size_t sStack_60;
  
  if (this->m_isRxEnabled == false) {
    if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
      return false;
    }
    __ptr = "Rx is disabled - cannot receive data with this GGWave instance\n";
    sStack_60 = 0x3f;
  }
  else {
    if ((this->m_tx).hasData != true) {
      factor = this->m_sampleRateInp / this->m_sampleRate;
      this_00 = &this->m_resampler;
      iVar3 = (this->m_rx).samplesNeeded;
      do {
        if (this->m_needResampling == true) {
          iVar3 = Resampler::resample(this_00,1.0 / factor,iVar3,
                                      (this->m_rx).amplitudeResampled.m_data,(float *)0x0);
          iVar3 = iVar3 + 4;
        }
        uVar12 = iVar3 * this->m_sampleSizeInp;
        if (nBytes < uVar12) {
          uVar12 = nBytes;
        }
        if (uVar12 == 0) {
          return true;
        }
        if (this->m_sampleFormatInp - GGWAVE_SAMPLE_FORMAT_U8 < 4) {
          pfVar10 = (float *)(this->m_rx).amplitudeTmp.m_data;
LAB_00106db4:
          memcpy(pfVar10,data,(ulong)uVar12);
        }
        else if (this->m_sampleFormatInp == GGWAVE_SAMPLE_FORMAT_F32) {
          pfVar10 = (this->m_rx).amplitudeResampled.m_data;
          goto LAB_00106db4;
        }
        uVar4 = uVar12 / (uint)this->m_sampleSizeInp;
        if (uVar12 % (uint)this->m_sampleSizeInp != 0) {
          if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
            fprintf((anonymous_namespace)::g_fptr,
                    "Failure during capture - provided bytes (%d) are not multiple of sample size (%d)\n"
                    ,(ulong)uVar12);
          }
          (this->m_rx).samplesNeeded = this->m_samplesPerFrame;
          return true;
        }
        lVar5 = (long)(int)uVar4;
        switch(this->m_sampleFormatInp) {
        case GGWAVE_SAMPLE_FORMAT_U8:
          pfVar10 = (this->m_rx).amplitudeResampled.m_data;
          puVar1 = (this->m_rx).amplitudeTmp.m_data;
          for (lVar11 = 0; lVar11 < lVar5; lVar11 = lVar11 + 1) {
            pfVar10[lVar11] = (float)(int)(puVar1[lVar11] - 0x80) * 0.0078125;
          }
          break;
        case GGWAVE_SAMPLE_FORMAT_I8:
          pfVar10 = (this->m_rx).amplitudeResampled.m_data;
          puVar1 = (this->m_rx).amplitudeTmp.m_data;
          for (lVar11 = 0; lVar11 < lVar5; lVar11 = lVar11 + 1) {
            pfVar10[lVar11] = (float)(int)(char)puVar1[lVar11] * 0.0078125;
          }
          break;
        case GGWAVE_SAMPLE_FORMAT_U16:
          pfVar10 = (this->m_rx).amplitudeResampled.m_data;
          puVar1 = (this->m_rx).amplitudeTmp.m_data;
          for (lVar11 = 0; lVar11 < lVar5; lVar11 = lVar11 + 1) {
            pfVar10[lVar11] =
                 (float)(int)(*(ushort *)(puVar1 + lVar11 * 2) - 0x8000) * 3.0517578e-05;
          }
          break;
        case GGWAVE_SAMPLE_FORMAT_I16:
          pfVar10 = (this->m_rx).amplitudeResampled.m_data;
          puVar1 = (this->m_rx).amplitudeTmp.m_data;
          for (lVar11 = 0; lVar11 < lVar5; lVar11 = lVar11 + 1) {
            pfVar10[lVar11] = (float)(int)*(short *)(puVar1 + lVar11 * 2) * 3.0517578e-05;
          }
        }
        iVar3 = this->m_samplesPerFrame;
        uVar8 = iVar3 - (this->m_rx).samplesNeeded;
        if (this->m_needResampling == false) {
          pfVar10 = (this->m_rx).amplitude.m_data;
          pfVar2 = (this->m_rx).amplitudeResampled.m_data;
          for (lVar11 = 0; lVar11 < lVar5; lVar11 = lVar11 + 1) {
            pfVar10[(int)(uVar8 + (int)lVar11)] = pfVar2[lVar11];
          }
        }
        else {
          iVar6 = iVar3;
          if ((int)uVar4 < 0x81) {
LAB_0010700c:
            (this->m_rx).samplesNeeded = iVar6;
            return true;
          }
          if (((this->m_rx).receiving == false) &&
             (this->m_sampleRate * factor * 60.0 < (float)(this->m_resampler).m_state.nSamplesTotal)
             ) {
            Resampler::reset(this_00);
          }
          iVar3 = Resampler::resample(this_00,factor,uVar4,(this->m_rx).amplitudeResampled.m_data,
                                      (this->m_rx).amplitude.m_data + uVar8);
          uVar4 = iVar3 + uVar8;
          iVar3 = this->m_samplesPerFrame;
        }
        iVar6 = iVar3 - uVar4;
        if (iVar6 != 0 && (int)uVar4 <= iVar3) goto LAB_0010700c;
        (this->m_rx).hasNewAmplitude = true;
        if (this->m_isFixedPayloadLength == true) {
          decode_fixed(this);
        }
        else {
          decode_variable(this);
        }
        data = (void *)((long)data + (ulong)uVar12);
        nBytes = nBytes - uVar12;
        iVar3 = this->m_samplesPerFrame;
        uVar4 = uVar4 - iVar3;
        pfVar10 = (this->m_rx).amplitude.m_data;
        uVar7 = 0;
        if (0 < (int)uVar4) {
          uVar7 = (ulong)uVar4;
        }
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          pfVar10[uVar9] = pfVar10[(long)iVar3 + uVar9];
        }
        iVar3 = iVar3 - uVar4;
        (this->m_rx).samplesNeeded = iVar3;
      } while( true );
    }
    if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
      return false;
    }
    __ptr = "Cannot decode while transmitting\n";
    sStack_60 = 0x21;
  }
  fwrite(__ptr,sStack_60,1,(anonymous_namespace)::g_fptr);
  return false;
}

Assistant:

bool GGWave::decode(const void * data, uint32_t nBytes) {
    if (m_isRxEnabled == false) {
        ggprintf("Rx is disabled - cannot receive data with this GGWave instance\n");
        return false;
    }

    if (m_tx.hasData) {
        ggprintf("Cannot decode while transmitting\n");
        return false;
    }

    auto dataBuffer = (uint8_t *) data;
    const float factor = m_sampleRateInp/m_sampleRate;

    while (true) {
        // read capture data
        uint32_t nBytesNeeded = m_rx.samplesNeeded*m_sampleSizeInp;

        if (m_needResampling) {
            // note : predict 4 extra samples just to make sure we have enough data
            nBytesNeeded = (m_resampler.resample(1.0f/factor, m_rx.samplesNeeded, m_rx.amplitudeResampled.data(), nullptr) + 4)*m_sampleSizeInp;
        }

        const uint32_t nBytesRecorded = GG_MIN(nBytes, nBytesNeeded);

        if (nBytesRecorded == 0) {
            break;
        }

        switch (m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: break;
            case GGWAVE_SAMPLE_FORMAT_U8:
            case GGWAVE_SAMPLE_FORMAT_I8:
            case GGWAVE_SAMPLE_FORMAT_U16:
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    memcpy(m_rx.amplitudeTmp.data(), dataBuffer, nBytesRecorded);
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    memcpy(m_rx.amplitudeResampled.data(), dataBuffer, nBytesRecorded);
                } break;
        }

        dataBuffer += nBytesRecorded;
        nBytes -= nBytesRecorded;

        if (nBytesRecorded % m_sampleSizeInp != 0) {
            ggprintf("Failure during capture - provided bytes (%d) are not multiple of sample size (%d)\n",
                    nBytesRecorded, m_sampleSizeInp);
            m_rx.samplesNeeded = m_samplesPerFrame;
            break;
        }

        // convert to 32-bit float
        int nSamplesRecorded = nBytesRecorded/m_sampleSizeInp;
        switch (m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    constexpr float scale = 1.0f/128;
                    auto p = reinterpret_cast<uint8_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(int16_t(*(p + i)) - 128)*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    constexpr float scale = 1.0f/128;
                    auto p = reinterpret_cast<int8_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(*(p + i))*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    constexpr float scale = 1.0f/32768;
                    auto p = reinterpret_cast<uint16_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(int32_t(*(p + i)) - 32768)*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    constexpr float scale = 1.0f/32768;
                    auto p = reinterpret_cast<int16_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(*(p + i))*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32: break;
        }

        uint32_t offset = m_samplesPerFrame - m_rx.samplesNeeded;

        if (m_needResampling) {
            if (nSamplesRecorded <= 2*Resampler::kWidth) {
                m_rx.samplesNeeded = m_samplesPerFrame;
                break;
            }

            // reset resampler state every minute
            if (!m_rx.receiving && m_resampler.nSamplesTotal() > 60.0f*factor*m_sampleRate) {
                m_resampler.reset();
            }

            int nSamplesResampled = offset + m_resampler.resample(factor, nSamplesRecorded, m_rx.amplitudeResampled.data(), m_rx.amplitude.data() + offset);
            nSamplesRecorded = nSamplesResampled;
        } else {
            for (int i = 0; i < nSamplesRecorded; ++i) {
                m_rx.amplitude[offset + i] = m_rx.amplitudeResampled[i];
            }
        }

        // we have enough bytes to do analysis
        if (nSamplesRecorded >= m_samplesPerFrame) {
            m_rx.hasNewAmplitude = true;

            if (m_isFixedPayloadLength) {
                decode_fixed();
            } else {
                decode_variable();
            }

            int nExtraSamples = nSamplesRecorded - m_samplesPerFrame;
            for (int i = 0; i < nExtraSamples; ++i) {
                m_rx.amplitude[i] = m_rx.amplitude[m_samplesPerFrame + i];
            }

            m_rx.samplesNeeded = m_samplesPerFrame - nExtraSamples;
        } else {
            m_rx.samplesNeeded = m_samplesPerFrame - nSamplesRecorded;
            break;
        }
    }

    return true;
}